

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# protocol.c
# Opt level: O0

ENetPeer *
enet_protocol_handle_connect(ENetHost *host,ENetProtocolHeader *header,ENetProtocol *command)

{
  byte bVar1;
  uint32_t uVar2;
  ENetPeer *pEVar3;
  ENetChannel *pEVar4;
  long in_RDX;
  _ENetHost *in_RDI;
  int i;
  ENetProtocol verifyCommand;
  ENetPeer *peer;
  ENetPeer *currentPeer;
  size_t duplicatePeers;
  size_t channelCount;
  ENetChannel *channel;
  enet_uint32 windowSize;
  enet_uint32 mtu;
  enet_uint8 outgoingSessionID;
  enet_uint8 incomingSessionID;
  undefined2 in_stack_ffffffffffffff60;
  enet_uint16 in_stack_ffffffffffffff62;
  enet_uint32 in_stack_ffffffffffffff64;
  uint uVar5;
  uint uVar6;
  int iVar7;
  enet_uint32 eVar8;
  undefined2 in_stack_ffffffffffffff74;
  undefined1 uVar9;
  undefined1 uVar10;
  undefined2 in_stack_ffffffffffffff78;
  ENetPeer *local_58;
  ulong local_48;
  ulong local_40;
  ENetChannel *local_38;
  uint local_2c;
  uint32_t local_28;
  byte local_22;
  byte local_21;
  ENetPeer *local_8;
  
  local_48 = 0;
  local_58 = (ENetPeer *)0x0;
  uVar2 = ntohl(*(uint32_t *)(in_RDX + 0x12));
  local_40 = (ulong)uVar2;
  if ((local_40 == 0) || (0xff < local_40)) {
    local_8 = (ENetPeer *)0x0;
  }
  else {
    for (iVar7 = 0; (ulong)(long)iVar7 < in_RDI->peerCount; iVar7 = iVar7 + 1) {
      pEVar3 = in_RDI->peer_list[iVar7];
      if ((((pEVar3->state != ENET_PEER_STATE_DISCONNECTED) &&
           ((pEVar3->address).host == (in_RDI->receivedAddress).host)) &&
          ((pEVar3->address).port == (in_RDI->receivedAddress).port)) &&
         (pEVar3->connectID == *(enet_uint32 *)(in_RDX + 0x2a))) {
        return (ENetPeer *)0x0;
      }
    }
    for (eVar8 = 0; (ulong)(long)(int)eVar8 < in_RDI->peerCount; eVar8 = eVar8 + 1) {
      pEVar3 = in_RDI->peer_list[(int)eVar8];
      if (pEVar3->state == ENET_PEER_STATE_DISCONNECTED) {
        if (local_58 == (ENetPeer *)0x0) {
          local_58 = pEVar3;
        }
      }
      else if ((pEVar3->state != ENET_PEER_STATE_CONNECTING) &&
              ((pEVar3->address).host == (in_RDI->receivedAddress).host)) {
        if (((pEVar3->address).port == (in_RDI->receivedAddress).port) &&
           (pEVar3->connectID == *(enet_uint32 *)(in_RDX + 0x2a))) {
          return (ENetPeer *)0x0;
        }
        local_48 = local_48 + 1;
      }
    }
    if (in_RDI->peerCount <= (ulong)(long)(int)eVar8) {
      if (0xfffffe < (int)eVar8) {
        return (ENetPeer *)0x0;
      }
      in_RDI->peerCount = in_RDI->peerCount + 1;
      pEVar3 = (ENetPeer *)
               enet_malloc(CONCAT44(in_stack_ffffffffffffff64,
                                    CONCAT22(in_stack_ffffffffffffff62,in_stack_ffffffffffffff60)));
      in_RDI->peer_list[(int)eVar8] = pEVar3;
      memset(in_RDI->peer_list[(int)eVar8],0,0x1d8);
      local_58 = in_RDI->peer_list[(int)eVar8];
      local_58->host = in_RDI;
      local_58->incomingPeerID = eVar8;
      local_58->incomingSessionID = 0xff;
      local_58->outgoingSessionID = 0xff;
      local_58->data = (void *)0x0;
      enet_list_clear(&local_58->acknowledgements);
      enet_list_clear(&local_58->sentReliableCommands);
      enet_list_clear(&local_58->sentUnreliableCommands);
      enet_list_clear(&local_58->outgoingReliableCommands);
      enet_list_clear(&local_58->outgoingUnreliableCommands);
      enet_list_clear(&local_58->dispatchedCommands);
      enet_peer_reset((ENetPeer *)0x10b4fa);
    }
    if ((local_58 == (ENetPeer *)0x0) || (in_RDI->duplicatePeers <= local_48)) {
      local_8 = (ENetPeer *)0x0;
    }
    else {
      if (in_RDI->channelLimit < local_40) {
        local_40 = in_RDI->channelLimit;
      }
      pEVar4 = (ENetChannel *)
               enet_malloc(CONCAT44(in_stack_ffffffffffffff64,
                                    CONCAT22(in_stack_ffffffffffffff62,in_stack_ffffffffffffff60)));
      local_58->channels = pEVar4;
      if (local_58->channels == (ENetChannel *)0x0) {
        local_8 = (ENetPeer *)0x0;
      }
      else {
        local_58->channelCount = local_40;
        local_58->state = ENET_PEER_STATE_ACKNOWLEDGING_CONNECT;
        local_58->connectID = *(enet_uint32 *)(in_RDX + 0x2a);
        local_58->address = in_RDI->receivedAddress;
        uVar2 = ntohl(*(uint32_t *)(in_RDX + 4));
        local_58->outgoingPeerID = uVar2;
        uVar2 = ntohl(*(uint32_t *)(in_RDX + 0x16));
        local_58->incomingBandwidth = uVar2;
        uVar2 = ntohl(*(uint32_t *)(in_RDX + 0x1a));
        local_58->outgoingBandwidth = uVar2;
        uVar2 = ntohl(*(uint32_t *)(in_RDX + 0x1e));
        local_58->packetThrottleInterval = uVar2;
        uVar2 = ntohl(*(uint32_t *)(in_RDX + 0x22));
        local_58->packetThrottleAcceleration = uVar2;
        uVar2 = ntohl(*(uint32_t *)(in_RDX + 0x26));
        local_58->packetThrottleDeceleration = uVar2;
        uVar2 = ntohl(*(uint32_t *)(in_RDX + 0x2e));
        local_58->eventData = uVar2;
        if (*(char *)(in_RDX + 8) == -1) {
          bVar1 = local_58->outgoingSessionID;
        }
        else {
          bVar1 = *(byte *)(in_RDX + 8);
        }
        uVar6 = (uint)bVar1;
        local_21 = bVar1 + 1 & 3;
        if (local_21 == local_58->outgoingSessionID) {
          local_21 = local_21 + 1 & 3;
        }
        local_58->outgoingSessionID = local_21;
        if (*(char *)(in_RDX + 9) == -1) {
          bVar1 = local_58->incomingSessionID;
        }
        else {
          bVar1 = *(byte *)(in_RDX + 9);
        }
        uVar5 = (uint)bVar1;
        local_22 = bVar1 + 1 & 3;
        if (local_22 == local_58->incomingSessionID) {
          local_22 = local_22 + 1 & 3;
        }
        local_58->incomingSessionID = local_22;
        for (local_38 = local_58->channels; local_38 < local_58->channels + local_40;
            local_38 = local_38 + 1) {
          local_38->outgoingReliableSequenceNumber = 0;
          local_38->outgoingUnreliableSequenceNumber = 0;
          local_38->incomingReliableSequenceNumber = 0;
          local_38->incomingUnreliableSequenceNumber = 0;
          enet_list_clear(&local_38->incomingReliableCommands);
          enet_list_clear(&local_38->incomingUnreliableCommands);
          local_38->usedReliableWindows = 0;
          memset(local_38->reliableWindows,0,0x20);
        }
        local_28 = ntohl(*(uint32_t *)(in_RDX + 10));
        if (local_28 < 0x240) {
          local_28 = 0x240;
        }
        else if (0x1000 < local_28) {
          local_28 = 0x1000;
        }
        local_58->mtu = local_28;
        if ((in_RDI->outgoingBandwidth == 0) && (local_58->incomingBandwidth == 0)) {
          local_58->windowSize = 0x10000;
        }
        else if ((in_RDI->outgoingBandwidth == 0) || (local_58->incomingBandwidth == 0)) {
          if (local_58->incomingBandwidth < in_RDI->outgoingBandwidth) {
            in_stack_ffffffffffffff64 = in_RDI->outgoingBandwidth;
          }
          else {
            in_stack_ffffffffffffff64 = local_58->incomingBandwidth;
          }
          local_58->windowSize = (in_stack_ffffffffffffff64 >> 0x10) << 0xc;
        }
        else {
          if (in_RDI->outgoingBandwidth < local_58->incomingBandwidth) {
            in_stack_ffffffffffffff62 = (enet_uint16)(in_RDI->outgoingBandwidth >> 0x10);
          }
          else {
            in_stack_ffffffffffffff62 = (enet_uint16)(local_58->incomingBandwidth >> 0x10);
          }
          local_58->windowSize = (uint)in_stack_ffffffffffffff62 << 0xc;
        }
        if (local_58->windowSize < 0x1000) {
          local_58->windowSize = 0x1000;
        }
        else if (0x10000 < local_58->windowSize) {
          local_58->windowSize = 0x10000;
        }
        if (in_RDI->incomingBandwidth == 0) {
          local_2c = 0x10000;
        }
        else {
          local_2c = (in_RDI->incomingBandwidth >> 0x10) << 0xc;
        }
        uVar2 = ntohl(*(uint32_t *)(in_RDX + 0xe));
        if (uVar2 < local_2c) {
          local_2c = ntohl(*(uint32_t *)(in_RDX + 0xe));
        }
        if (local_2c < 0x1000) {
          local_2c = 0x1000;
        }
        else if (0x10000 < local_2c) {
          local_2c = 0x10000;
        }
        uVar9 = 0x83;
        uVar10 = 0xff;
        uVar2 = htonl(local_58->incomingPeerID);
        htonl(local_58->mtu);
        htonl(local_2c);
        htonl((uint32_t)local_40);
        htonl(in_RDI->incomingBandwidth);
        htonl(in_RDI->outgoingBandwidth);
        htonl(local_58->packetThrottleInterval);
        htonl(local_58->packetThrottleAcceleration);
        htonl(local_58->packetThrottleDeceleration);
        enet_peer_queue_outgoing_command
                  ((ENetPeer *)
                   CONCAT17(local_22,CONCAT16(local_21,CONCAT42(uVar2,in_stack_ffffffffffffff78))),
                   (ENetProtocol *)
                   CONCAT17(uVar10,CONCAT16(uVar9,CONCAT24(in_stack_ffffffffffffff74,eVar8))),
                   (ENetPacket *)CONCAT44(uVar6,uVar5),in_stack_ffffffffffffff64,
                   in_stack_ffffffffffffff62);
        local_8 = local_58;
      }
    }
  }
  return local_8;
}

Assistant:

static ENetPeer *
enet_protocol_handle_connect (ENetHost * host, ENetProtocolHeader * header, ENetProtocol * command)
{
    enet_uint8 incomingSessionID, outgoingSessionID;
    enet_uint32 mtu, windowSize;
    ENetChannel * channel;
    size_t channelCount, duplicatePeers = 0;
    ENetPeer * currentPeer, * peer = NULL;
    ENetProtocol verifyCommand;
    int i;

    channelCount = ENET_NET_TO_HOST_32 (command -> connect.channelCount);

    if (channelCount < ENET_PROTOCOL_MINIMUM_CHANNEL_COUNT ||
        channelCount > ENET_PROTOCOL_MAXIMUM_CHANNEL_COUNT)
      return NULL;

    for (i = 0; i < host -> peerCount; i++ ) 
    {
	currentPeer = host -> peer_list[i];

        if (currentPeer -> state != ENET_PEER_STATE_DISCONNECTED &&
            currentPeer -> address.host == host -> receivedAddress.host &&
            currentPeer -> address.port == host -> receivedAddress.port &&
            currentPeer -> connectID == command -> connect.connectID)
          return NULL;
    }

    for (i = 0; i < host -> peerCount; i++ )
    {
	currentPeer = host -> peer_list[i];

        if (currentPeer -> state == ENET_PEER_STATE_DISCONNECTED)
        {
            if (peer == NULL)
              peer = currentPeer;
        }
        else 
        if (currentPeer -> state != ENET_PEER_STATE_CONNECTING &&
            currentPeer -> address.host == host -> receivedAddress.host)
        {
            if (currentPeer -> address.port == host -> receivedAddress.port &&
                currentPeer -> connectID == command -> connect.connectID)
              return NULL;

            ++ duplicatePeers;
        }
    }

    if (i >= host -> peerCount)
    {
	if (i >= ENET_PROTOCOL_MAXIMUM_PEER_ID) 
	    return NULL;
	host -> peerCount++;
	host -> peer_list[i] = enet_malloc (sizeof (ENetPeer));
	memset (host -> peer_list[i], 0, sizeof (ENetPeer));
	peer = host->peer_list[i];
	peer -> host = host;
	peer -> incomingPeerID = i;
	peer -> outgoingSessionID = peer -> incomingSessionID = 0xFF;
	peer -> data = NULL;

	enet_list_clear (& peer -> acknowledgements);
	enet_list_clear (& peer -> sentReliableCommands);
	enet_list_clear (& peer -> sentUnreliableCommands);
	enet_list_clear (& peer -> outgoingReliableCommands);
	enet_list_clear (& peer -> outgoingUnreliableCommands);
	enet_list_clear (& peer -> dispatchedCommands);

	enet_peer_reset (peer);
    }

    if (peer == NULL || duplicatePeers >= host -> duplicatePeers)
      return NULL;

    if (channelCount > host -> channelLimit)
      channelCount = host -> channelLimit;
    peer -> channels = (ENetChannel *) enet_malloc (channelCount * sizeof (ENetChannel));
    if (peer -> channels == NULL)
      return NULL;
    peer -> channelCount = channelCount;
    peer -> state = ENET_PEER_STATE_ACKNOWLEDGING_CONNECT;
    peer -> connectID = command -> connect.connectID;
    peer -> address = host -> receivedAddress;
    peer -> outgoingPeerID = ENET_NET_TO_HOST_32 (command -> connect.outgoingPeerID);
    peer -> incomingBandwidth = ENET_NET_TO_HOST_32 (command -> connect.incomingBandwidth);
    peer -> outgoingBandwidth = ENET_NET_TO_HOST_32 (command -> connect.outgoingBandwidth);
    peer -> packetThrottleInterval = ENET_NET_TO_HOST_32 (command -> connect.packetThrottleInterval);
    peer -> packetThrottleAcceleration = ENET_NET_TO_HOST_32 (command -> connect.packetThrottleAcceleration);
    peer -> packetThrottleDeceleration = ENET_NET_TO_HOST_32 (command -> connect.packetThrottleDeceleration);
    peer -> eventData = ENET_NET_TO_HOST_32 (command -> connect.data);

    incomingSessionID = command -> connect.incomingSessionID == 0xFF ? peer -> outgoingSessionID : command -> connect.incomingSessionID;
    incomingSessionID = (incomingSessionID + 1) & (ENET_PROTOCOL_HEADER_SESSION_MASK >> ENET_PROTOCOL_HEADER_SESSION_SHIFT);
    if (incomingSessionID == peer -> outgoingSessionID)
      incomingSessionID = (incomingSessionID + 1) & (ENET_PROTOCOL_HEADER_SESSION_MASK >> ENET_PROTOCOL_HEADER_SESSION_SHIFT);
    peer -> outgoingSessionID = incomingSessionID;

    outgoingSessionID = command -> connect.outgoingSessionID == 0xFF ? peer -> incomingSessionID : command -> connect.outgoingSessionID;
    outgoingSessionID = (outgoingSessionID + 1) & (ENET_PROTOCOL_HEADER_SESSION_MASK >> ENET_PROTOCOL_HEADER_SESSION_SHIFT);
    if (outgoingSessionID == peer -> incomingSessionID)
      outgoingSessionID = (outgoingSessionID + 1) & (ENET_PROTOCOL_HEADER_SESSION_MASK >> ENET_PROTOCOL_HEADER_SESSION_SHIFT);
    peer -> incomingSessionID = outgoingSessionID;

    for (channel = peer -> channels;
         channel < & peer -> channels [channelCount];
         ++ channel)
    {
        channel -> outgoingReliableSequenceNumber = 0;
        channel -> outgoingUnreliableSequenceNumber = 0;
        channel -> incomingReliableSequenceNumber = 0;
        channel -> incomingUnreliableSequenceNumber = 0;

        enet_list_clear (& channel -> incomingReliableCommands);
        enet_list_clear (& channel -> incomingUnreliableCommands);

        channel -> usedReliableWindows = 0;
        memset (channel -> reliableWindows, 0, sizeof (channel -> reliableWindows));
    }

    mtu = ENET_NET_TO_HOST_32 (command -> connect.mtu);

    if (mtu < ENET_PROTOCOL_MINIMUM_MTU)
      mtu = ENET_PROTOCOL_MINIMUM_MTU;
    else
    if (mtu > ENET_PROTOCOL_MAXIMUM_MTU)
      mtu = ENET_PROTOCOL_MAXIMUM_MTU;

    peer -> mtu = mtu;

    if (host -> outgoingBandwidth == 0 &&
        peer -> incomingBandwidth == 0)
      peer -> windowSize = ENET_PROTOCOL_MAXIMUM_WINDOW_SIZE;
    else
    if (host -> outgoingBandwidth == 0 ||
        peer -> incomingBandwidth == 0)
      peer -> windowSize = (ENET_MAX (host -> outgoingBandwidth, peer -> incomingBandwidth) /
                                    ENET_PEER_WINDOW_SIZE_SCALE) *
                                      ENET_PROTOCOL_MINIMUM_WINDOW_SIZE;
    else
      peer -> windowSize = (ENET_MIN (host -> outgoingBandwidth, peer -> incomingBandwidth) /
                                    ENET_PEER_WINDOW_SIZE_SCALE) * 
                                      ENET_PROTOCOL_MINIMUM_WINDOW_SIZE;

    if (peer -> windowSize < ENET_PROTOCOL_MINIMUM_WINDOW_SIZE)
      peer -> windowSize = ENET_PROTOCOL_MINIMUM_WINDOW_SIZE;
    else
    if (peer -> windowSize > ENET_PROTOCOL_MAXIMUM_WINDOW_SIZE)
      peer -> windowSize = ENET_PROTOCOL_MAXIMUM_WINDOW_SIZE;

    if (host -> incomingBandwidth == 0)
      windowSize = ENET_PROTOCOL_MAXIMUM_WINDOW_SIZE;
    else
      windowSize = (host -> incomingBandwidth / ENET_PEER_WINDOW_SIZE_SCALE) *
                     ENET_PROTOCOL_MINIMUM_WINDOW_SIZE;

    if (windowSize > ENET_NET_TO_HOST_32 (command -> connect.windowSize))
      windowSize = ENET_NET_TO_HOST_32 (command -> connect.windowSize);

    if (windowSize < ENET_PROTOCOL_MINIMUM_WINDOW_SIZE)
      windowSize = ENET_PROTOCOL_MINIMUM_WINDOW_SIZE;
    else
    if (windowSize > ENET_PROTOCOL_MAXIMUM_WINDOW_SIZE)
      windowSize = ENET_PROTOCOL_MAXIMUM_WINDOW_SIZE;

    verifyCommand.header.command = ENET_PROTOCOL_COMMAND_VERIFY_CONNECT | ENET_PROTOCOL_COMMAND_FLAG_ACKNOWLEDGE;
    verifyCommand.header.channelID = 0xFF;
    verifyCommand.verifyConnect.outgoingPeerID = ENET_HOST_TO_NET_32 (peer -> incomingPeerID);
    verifyCommand.verifyConnect.incomingSessionID = incomingSessionID;
    verifyCommand.verifyConnect.outgoingSessionID = outgoingSessionID;
    verifyCommand.verifyConnect.mtu = ENET_HOST_TO_NET_32 (peer -> mtu);
    verifyCommand.verifyConnect.windowSize = ENET_HOST_TO_NET_32 (windowSize);
    verifyCommand.verifyConnect.channelCount = ENET_HOST_TO_NET_32 (channelCount);
    verifyCommand.verifyConnect.incomingBandwidth = ENET_HOST_TO_NET_32 (host -> incomingBandwidth);
    verifyCommand.verifyConnect.outgoingBandwidth = ENET_HOST_TO_NET_32 (host -> outgoingBandwidth);
    verifyCommand.verifyConnect.packetThrottleInterval = ENET_HOST_TO_NET_32 (peer -> packetThrottleInterval);
    verifyCommand.verifyConnect.packetThrottleAcceleration = ENET_HOST_TO_NET_32 (peer -> packetThrottleAcceleration);
    verifyCommand.verifyConnect.packetThrottleDeceleration = ENET_HOST_TO_NET_32 (peer -> packetThrottleDeceleration);
    verifyCommand.verifyConnect.connectID = peer -> connectID;

    enet_peer_queue_outgoing_command (peer, & verifyCommand, NULL, 0, 0);

    return peer;
}